

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

Var * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Var>(Allocator *this,Var *ast)

{
  Var *this_00;
  Var *local_20;
  
  this_00 = (Var *)operator_new(0x88);
  Var::Var(this_00,ast);
  local_20 = this_00;
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            (&this->allocated,(value_type *)&local_20);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }